

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O2

double amrex::detail::bisect_prob_hi<double>(Real plo,Real phi,Real idx,int ilo,int ihi,Real tol)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double x;
  double dVar4;
  double x_00;
  double local_80;
  anon_class_24_4_3035a155 local_38;
  
  x = phi - tol;
  dVar4 = floor((x - plo) * idx);
  if ((int)dVar4 < 0 || ihi < (int)dVar4 + ilo) {
    local_80 = phi + -0.5 / idx;
    local_38.plo = plo;
    local_38.idx = idx;
    local_38.ilo = ilo;
    local_38.ihi = ihi;
    dVar4 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()(&local_38,local_80);
    dVar3 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()(&local_38,x);
    if (((dVar4 != 0.0) || (x_00 = dVar4, NAN(dVar4))) &&
       ((dVar3 != 0.0 || (x_00 = dVar3, NAN(dVar3))))) {
      x_00 = (local_80 + x) * 0.5;
      uVar1 = 1;
      while ((uVar1 < 0x65 && (tol <= x - local_80))) {
        dVar3 = ABS(x + local_80) * 2.220446049250313e-16;
        if ((ABS(local_80 - x) < 2.2250738585072014e-308) || (ABS(local_80 - x) <= dVar3 + dVar3))
        break;
        x_00 = (x + local_80) * 0.5;
        dVar3 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()(&local_38,x_00);
        if ((dVar3 == 0.0) && (!NAN(dVar3))) break;
        if (0.0 <= dVar4 * dVar3) {
          local_80 = x_00;
        }
        uVar2 = -(ulong)(dVar4 * dVar3 < 0.0);
        x = (double)(~uVar2 & (ulong)x | uVar2 & (ulong)x_00);
        dVar4 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()(&local_38,local_80);
        bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()(&local_38,x);
        uVar1 = uVar1 + 1;
      }
    }
    x = x_00 - tol;
  }
  return x;
}

Assistant:

T bisect_prob_hi (amrex::Real plo, amrex::Real phi, amrex::Real idx, int ilo, int ihi, amrex::Real tol) {
            T hi = static_cast<T>(phi - tol);
            bool safe;
            {
                int i = int(Math::floor((hi - plo)*idx)) + ilo;
                safe = i >= ilo && i <= ihi;
            }
            if (safe) {
                return hi;
            } else {
                // bisect the point at which the cell no longer maps to inside the domain
                T lo = static_cast<T>(phi - 0.5_rt/idx);
                T mid = bisect(lo, hi,
                               [=] AMREX_GPU_HOST_DEVICE (T x) -> T
                                   {
                                       int i = int(Math::floor((x - plo)*idx)) + ilo;
                                       bool inside = i >= ilo && i <= ihi;
                                       return static_cast<T>(inside) - T(0.5);
                                   }, static_cast<T>(tol));
                return mid - static_cast<T>(tol);
            }
        }